

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_celsius.cc
# Opt level: O0

void __thiscall hwtest::pgraph::MthdCelsiusColorMask::emulate_mthd(MthdCelsiusColorMask *this)

{
  uint local_14;
  uint32_t err;
  MthdCelsiusColorMask *this_local;
  
  pgraph_celsius_pre_icmd(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp);
  local_14 = (uint)(((this->super_SingleMthdTest).super_MthdTest.val & 0xfefefefe) != 0);
  if ((long)((ulong)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_config_c
            << 0x37) < 0) {
    local_14 = local_14 | 4;
  }
  if (local_14 == 0) {
    if (-1 < (long)((ulong)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource
                   << 0x3e)) {
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_config_a =
           (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_config_a &
           0xdfffffff | ((this->super_SingleMthdTest).super_MthdTest.val & 1) << 0x1d;
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_config_a =
           (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_config_a &
           0xefffffff |
           (uint)((((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x37) >> 0x3f) << 0x1c
                 );
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_config_a =
           (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_config_a &
           0xf7ffffff |
           (uint)((((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x2f) >> 0x3f) << 0x1b
                 );
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_config_a =
           (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_config_a &
           0xfbffffff |
           (uint)((((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x27) >> 0x3f) << 0x1a
                 );
      pgraph_celsius_icmd(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,0x1c,
                          (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                          bundle_config_a,true);
    }
  }
  else {
    MthdTest::warn((MthdTest *)this,local_14);
  }
  return;
}

Assistant:

void emulate_mthd() override {
		pgraph_celsius_pre_icmd(&exp);
		uint32_t err = 0;
		if (val & ~0x1010101)
			err |= 1;
		if (extr(exp.celsius_config_c, 8, 1))
			err |= 4;
		if (err) {
			warn(err);
		} else {
			if (!extr(exp.nsource, 1, 1)) {
				insrt(exp.bundle_config_a, 29, 1, extr(val, 0, 1));
				insrt(exp.bundle_config_a, 28, 1, extr(val, 8, 1));
				insrt(exp.bundle_config_a, 27, 1, extr(val, 16, 1));
				insrt(exp.bundle_config_a, 26, 1, extr(val, 24, 1));
				pgraph_celsius_icmd(&exp, 0x1c, exp.bundle_config_a, true);
			}
		}
	}